

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_filter_by_ext.c
# Opt level: O0

int archive_write_set_format_filter_by_ext(archive *a,char *filename)

{
  int iVar1;
  int format_state;
  int names_index;
  char *filename_local;
  archive *a_local;
  
  iVar1 = get_array_index(filename);
  if (iVar1 < 0) {
    archive_set_error(a,0x16,"No such format \'%s\'",filename);
    a->state = 0x8000;
    a_local._4_4_ = -0x1e;
  }
  else {
    a_local._4_4_ = (*names[iVar1].format)(a);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = (*names[iVar1].filter)(a);
    }
  }
  return a_local._4_4_;
}

Assistant:

int
archive_write_set_format_filter_by_ext(struct archive *a, const char *filename)
{
  int names_index = get_array_index(filename);
  
  if (names_index >= 0)
  {  
    int format_state = (names[names_index].format)(a);
    if (format_state == ARCHIVE_OK)
      return ((names[names_index].filter)(a));
    else
      return format_state;
  }    

  archive_set_error(a, EINVAL, "No such format '%s'", filename);
  a->state = ARCHIVE_STATE_FATAL;
  return (ARCHIVE_FATAL);
}